

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

short __thiscall
duckdb::Interpolator<false>::Operation<short,short,duckdb::MadAccessor<short,short,short>>
          (Interpolator<false> *this,short *v_t,Vector *result,
          MadAccessor<short,_short,_short> *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>_> __comp_01;
  bool bVar3;
  short sVar4;
  ulong uVar5;
  idx_t iVar6;
  OutOfRangeException *pOVar7;
  short sVar8;
  idx_t iVar9;
  idx_t iVar10;
  int iVar11;
  unkbyte10 Var12;
  short result_1;
  short local_42;
  string local_40;
  
  bVar3 = this->desc;
  iVar9 = this->CRN;
  iVar10 = this->FRN;
  iVar1 = this->begin;
  iVar6 = this->end;
  local_40._M_dataplus._M_p = (pointer)accessor;
  local_40._M_string_length = (size_type)accessor;
  local_40.field_2._M_local_buf[0] = bVar3;
  if (iVar9 == iVar10) {
    if (iVar9 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)((iVar6 * 2 - iVar1) - iVar1) >> 1;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar9 = this->FRN;
    }
    sVar4 = v_t[iVar9] - *accessor->median;
    if (sVar4 == -0x8000) {
      pOVar7 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<short>(pOVar7,&local_40,-0x8000);
      __cxa_throw(pOVar7,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    sVar8 = -sVar4;
    if (0 < sVar4) {
      sVar8 = sVar4;
    }
    bVar3 = TryCast::Operation<short,short>(sVar8,&local_42,false);
    if (!bVar3) {
      Var12 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar8,(short)((unkuint10)Var12 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var12,(string *)&local_40);
      __cxa_throw((InvalidInputException *)Var12,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar10 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)((iVar6 * 2 - iVar1) - iVar1) >> 1;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>>
                (v_t + iVar1,v_t + iVar10,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar10 = this->FRN;
      iVar9 = this->CRN;
      iVar6 = this->end;
    }
    local_40._M_dataplus._M_p = (pointer)accessor;
    local_40._M_string_length = (size_type)accessor;
    local_40.field_2._M_local_buf[0] = bVar3;
    if (iVar9 != iVar6 && iVar10 != iVar6) {
      uVar5 = (long)(iVar6 * 2 + iVar10 * -2) >> 1;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<short,short,short>>>>
                (v_t + iVar10,v_t + iVar9,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar10 = this->FRN;
    }
    sVar4 = v_t[iVar10] - *accessor->median;
    if (sVar4 == -0x8000) {
      pOVar7 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<short>(pOVar7,&local_40,-0x8000);
      __cxa_throw(pOVar7,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    sVar8 = -sVar4;
    if (0 < sVar4) {
      sVar8 = sVar4;
    }
    bVar3 = TryCast::Operation<short,short>(sVar8,&local_42,false);
    if (!bVar3) {
      Var12 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar8,(short)((unkuint10)Var12 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var12,(string *)&local_40);
      __cxa_throw((InvalidInputException *)Var12,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    sVar4 = v_t[this->CRN] - *accessor->median;
    if (sVar4 == -0x8000) {
      pOVar7 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<short>(pOVar7,&local_40,-0x8000);
      __cxa_throw(pOVar7,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar11 = (int)local_42;
    sVar8 = -sVar4;
    if (0 < sVar4) {
      sVar8 = sVar4;
    }
    bVar3 = TryCast::Operation<short,short>(sVar8,&local_42,false);
    if (!bVar3) {
      Var12 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar8,(short)((unkuint10)Var12 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var12,(string *)&local_40);
      __cxa_throw((InvalidInputException *)Var12,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_42 = (short)(int)((double)(local_42 - iVar11) *
                            (this->RN -
                            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                           (double)iVar11);
  }
  return local_42;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}